

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O3

void xmrig::HttpContext::attach(http_parser_settings *settings)

{
  settings->on_message_begin = (http_cb)0x0;
  settings->on_status = (http_data_cb)0x0;
  settings->on_chunk_header = (http_cb)0x0;
  settings->on_chunk_complete = (http_cb)0x0;
  settings->on_url = attach::anon_class_1_0_00000001::__invoke;
  settings->on_header_field = onHeaderField;
  settings->on_header_value = onHeaderValue;
  settings->on_headers_complete = attach::anon_class_1_0_00000001::__invoke;
  settings->on_body = attach::anon_class_1_0_00000001::__invoke;
  settings->on_message_complete = attach::anon_class_1_0_00000001::__invoke;
  return;
}

Assistant:

void xmrig::HttpContext::attach(http_parser_settings *settings)
{
    settings->on_message_begin  = nullptr;
    settings->on_status         = nullptr;
    settings->on_chunk_header   = nullptr;
    settings->on_chunk_complete = nullptr;

    settings->on_url = [](http_parser *parser, const char *at, size_t length) -> int
    {
        static_cast<HttpContext*>(parser->data)->url = std::string(at, length);
        return 0;
    };

    settings->on_header_field = onHeaderField;
    settings->on_header_value = onHeaderValue;

    settings->on_headers_complete = [](http_parser* parser) -> int {
        auto ctx = static_cast<HttpContext*>(parser->data);
        ctx->status = parser->status_code;

        if (parser->type == HTTP_REQUEST) {
            ctx->method = parser->method;
        }

        if (!ctx->m_lastHeaderField.empty()) {
            ctx->setHeader();
        }

        return 0;
    };

    settings->on_body = [](http_parser *parser, const char *at, size_t len) -> int
    {
        static_cast<HttpContext*>(parser->data)->body += std::string(at, len);

        return 0;
    };

    settings->on_message_complete = [](http_parser *parser) -> int
    {
        auto ctx = static_cast<HttpContext*>(parser->data);
        ctx->m_listener->onHttpData(*ctx);
        ctx->m_listener = nullptr;

        return 0;
    };
}